

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  cmGlobalGenerator *pcVar1;
  cmLocalGenerator *pcVar2;
  cmMakefile *this_00;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> this_01;
  cmSourceFile *this_02;
  pointer ppcVar3;
  TargetType TVar4;
  string *psVar5;
  cmSourceGroup *this_03;
  pointer puVar6;
  pointer puVar7;
  pointer ppcVar8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string linkName2;
  string linkName;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  allocator<char> local_121;
  cmExtraEclipseCDT4Generator *local_120;
  _Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_118;
  cmAlphaNum local_f8;
  pointer local_c8;
  pointer local_c0;
  cmXMLWriter *local_b8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *local_b0;
  pointer local_a8;
  string local_a0;
  string local_80;
  cmAlphaNum local_60;
  
  local_120 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"[Targets]",(allocator<char> *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"virtual:/virtual",(allocator<char> *)&local_60);
  AppendLinkedResource(xml,&local_80,(string *)&local_f8,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_f8);
  pcVar1 = (local_120->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_c8 = (pcVar1->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (pcVar1->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = xml;
  while (puVar6 != local_c8) {
    pcVar2 = (puVar6->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    this_00 = pcVar2->Makefile;
    local_a8 = *(pointer *)
                ((long)&(pcVar2->GeneratorTargets).
                        super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                + 8);
    local_b0 = &this_00->SourceGroups;
    local_c0 = puVar6;
    for (puVar7 = *(pointer *)
                   &(pcVar2->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl; puVar7 != local_a8; puVar7 = puVar7 + 1) {
      local_f8.View_._M_len = local_80._M_string_length;
      local_f8.View_._M_str = local_80._M_dataplus._M_p;
      local_60.View_._M_len = 1;
      local_60.Digits_[0] = '/';
      local_60.View_._M_str = local_60.Digits_;
      cmStrCat<>(&local_a0,&local_f8,&local_60);
      TVar4 = cmGeneratorTarget::GetType
                        ((cmGeneratorTarget *)
                         (puVar7->_M_t).
                         super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                        );
      if (TVar4 < UTILITY) {
        cmGeneratorTarget::GetType
                  ((cmGeneratorTarget *)
                   (puVar7->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        std::__cxx11::string::append((char *)&local_a0);
        cmGeneratorTarget::GetName_abi_cxx11_
                  ((cmGeneratorTarget *)
                   (puVar7->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        std::__cxx11::string::append((string *)&local_a0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"virtual:/virtual",(allocator<char> *)&local_60);
        AppendLinkedResource(xml,&local_a0,(string *)&local_f8,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_f8);
        if (local_120->GenerateLinkedResources != false) {
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_60,local_b0);
          local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_01.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
          _M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
          super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
               (puVar7->_M_t).
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"CMAKE_BUILD_TYPE",&local_121);
          psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_f8);
          cmGeneratorTarget::GetSourceFiles
                    ((cmGeneratorTarget *)
                     this_01.
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_118,psVar5);
          std::__cxx11::string::~string((string *)&local_f8);
          ppcVar3 = local_118._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar8 = local_118._M_impl.super__Vector_impl_data._M_start; xml = local_b8,
              ppcVar8 != ppcVar3; ppcVar8 = ppcVar8 + 1) {
            this_02 = *ppcVar8;
            psVar5 = cmSourceFile::ResolveFullPath(this_02,(string *)0x0,(string *)0x0);
            this_03 = cmMakefile::FindSourceGroup
                                (this_00,psVar5,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_60)
            ;
            cmSourceGroup::AssignSource(this_03,this_02);
          }
          WriteGroups(local_120,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_60,
                      &local_a0,local_b8);
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&local_118);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&local_60);
        }
      }
      std::__cxx11::string::~string((string *)&local_a0);
    }
    puVar6 = local_c0 + 1;
  }
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, linkName, "virtual:/virtual", VirtualFolder);

  for (const auto& lg : this->GlobalGenerator->GetLocalGenerators()) {
    cmMakefile* makefile = lg->GetMakefile();
    const auto& targets = lg->GetGeneratorTargets();

    for (const auto& target : targets) {
      std::string linkName2 = cmStrCat(linkName, '/');
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            (target->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                           : "[lib] ");
          linkName2 += prefix;
          linkName2 += target->GetName();
          cmExtraEclipseCDT4Generator::AppendLinkedResource(
            xml, linkName2, "virtual:/virtual", VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          std::vector<cmSourceFile*> files;
          target->GetSourceFiles(
            files, makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (cmSourceFile* sf : files) {
            // Add the file to the list of sources.
            std::string const& source = sf->ResolveFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source, sourceGroups);
            sourceGroup->AssignSource(sf);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}